

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveComments.cpp
# Opt level: O0

void Assimp::CommentRemover::RemoveMultiLineComments
               (char *szCommentStart,char *szCommentEnd,char *szBuffer,char chReplacement)

{
  int iVar1;
  size_t __n;
  size_t __n_00;
  char *pcVar2;
  bool bVar3;
  uint local_3c;
  uint i;
  size_t len2;
  size_t len;
  char *pcStack_20;
  char chReplacement_local;
  char *szBuffer_local;
  char *szCommentEnd_local;
  char *szCommentStart_local;
  
  bVar3 = false;
  if ((((szCommentStart != (char *)0x0) && (bVar3 = false, szCommentEnd != (char *)0x0)) &&
      (bVar3 = false, szBuffer != (char *)0x0)) && (bVar3 = false, *szCommentStart != '\0')) {
    bVar3 = *szCommentEnd != '\0';
  }
  if (!bVar3) {
    __assert_fail("__null != szCommentStart && __null != szCommentEnd && __null != szBuffer && *szCommentStart && *szCommentEnd"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/RemoveComments.cpp"
                  ,0x57,
                  "static void Assimp::CommentRemover::RemoveMultiLineComments(const char *, const char *, char *, char)"
                 );
  }
  __n = strlen(szCommentEnd);
  __n_00 = strlen(szCommentStart);
  pcStack_20 = szBuffer;
LAB_009e876f:
  do {
    while( true ) {
      if (*pcStack_20 == '\0') {
        return;
      }
      if ((*pcStack_20 == '\"') || (*pcStack_20 == '\'')) {
        do {
          pcVar2 = pcStack_20 + 1;
          bVar3 = false;
          if ((*pcStack_20 != '\0') && (bVar3 = false, *pcVar2 != '\"')) {
            bVar3 = *pcVar2 != '\'';
          }
          pcStack_20 = pcVar2;
        } while (bVar3);
      }
      iVar1 = strncmp(pcStack_20,szCommentStart,__n_00);
      if (iVar1 == 0) break;
      pcStack_20 = pcStack_20 + 1;
    }
    while( true ) {
      if (*pcStack_20 == '\0') goto LAB_009e876f;
      iVar1 = strncmp(pcStack_20,szCommentEnd,__n);
      if (iVar1 == 0) break;
      *pcStack_20 = chReplacement;
      pcStack_20 = pcStack_20 + 1;
    }
    for (local_3c = 0; local_3c < __n; local_3c = local_3c + 1) {
      *pcStack_20 = chReplacement;
      pcStack_20 = pcStack_20 + 1;
    }
  } while( true );
}

Assistant:

void CommentRemover::RemoveMultiLineComments(const char* szCommentStart,
    const char* szCommentEnd,char* szBuffer,
    char chReplacement)
{
    // validate parameters
    ai_assert(NULL != szCommentStart && NULL != szCommentEnd &&
        NULL != szBuffer && *szCommentStart && *szCommentEnd);

    const size_t len  = strlen(szCommentEnd);
    const size_t len2 = strlen(szCommentStart);

    while (*szBuffer)   {
        // skip over quotes
        if (*szBuffer == '\"' || *szBuffer == '\'')
            while (*szBuffer++ && *szBuffer != '\"' && *szBuffer != '\'');

        if (!strncmp(szBuffer,szCommentStart,len2))  {
            while (*szBuffer) {
                if (!::strncmp(szBuffer,szCommentEnd,len)) {
                    for (unsigned int i = 0; i < len;++i)
                        *szBuffer++ = chReplacement;

                    break;
                }
            *szBuffer++ = chReplacement;
            }
            continue;
        }
        ++szBuffer;
    }
}